

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  CppType CVar1;
  long lVar2;
  Type TVar3;
  CppType CVar4;
  uint32 uVar5;
  int iVar6;
  int32 iVar7;
  LogMessage *pLVar8;
  string *value_00;
  ulong uVar9;
  int64 value_01;
  size_t sStack_70;
  LogFinisher local_59;
  LogMessage local_58;
  
  TVar3 = FieldDescriptor::type(field);
  CVar1 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
  CVar4 = MapKey::type(value);
  if (CVar1 != CVar4) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4d5);
    pLVar8 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (FieldDescriptor::TypeToCppType(field->type())) == (value.type()): "
                       );
    LogFinisher::operator=(&local_59,pLVar8);
    LogMessage::~LogMessage(&local_58);
  }
  TVar3 = FieldDescriptor::type(field);
  switch(TVar3) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4dd);
    pLVar8 = LogMessage::operator<<(&local_58,"Unsupported");
    LogFinisher::operator=(&local_59,pLVar8);
    goto LAB_00336247;
  case TYPE_INT64:
    uVar9 = MapKey::GetInt64Value(value);
    goto LAB_0033628f;
  case TYPE_UINT64:
    uVar9 = MapKey::GetUInt64Value(value);
LAB_0033628f:
    lVar2 = 0x3f;
    if ((uVar9 | 1) != 0) {
      for (; (uVar9 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar6 = (int)lVar2;
LAB_003362b8:
    sStack_70 = (size_t)(iVar6 * 9 + 0x49U >> 6);
    break;
  case TYPE_INT32:
    iVar7 = MapKey::GetInt32Value(value);
    sStack_70 = io::CodedOutputStream::VarintSize32SignExtended(iVar7);
    break;
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    sStack_70 = 8;
    break;
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    sStack_70 = 4;
    break;
  case TYPE_BOOL:
    sStack_70 = 1;
    break;
  case TYPE_STRING:
    value_00 = MapKey::GetStringValue_abi_cxx11_(value);
    sStack_70 = WireFormatLite::StringSize(value_00);
    break;
  case TYPE_UINT32:
    uVar5 = MapKey::GetUInt32Value(value);
    iVar6 = 0x1f;
    if ((uVar5 | 1) != 0) {
      for (; (uVar5 | 1) >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    goto LAB_003362b8;
  case TYPE_SINT32:
    iVar7 = MapKey::GetInt32Value(value);
    sStack_70 = WireFormatLite::SInt32Size(iVar7);
    break;
  case MAX_TYPE:
    value_01 = MapKey::GetInt64Value(value);
    sStack_70 = WireFormatLite::SInt64Size(value_01);
    break;
  default:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4f8);
    pLVar8 = LogMessage::operator<<(&local_58,"Cannot get here");
    LogFinisher::operator=(&local_59,pLVar8);
LAB_00336247:
    LogMessage::~LogMessage(&local_58);
    sStack_70 = 0;
  }
  return sStack_70;
}

Assistant:

static size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                                     const MapKey& value) {
  GOOGLE_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}